

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproxy.cpp
# Opt level: O3

void issue_sleep_checks(void)

{
  long lVar1;
  pointer pDVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  LinuxRawSocket query_socket;
  LinuxRawSocket local_a0;
  
  LinuxRawSocket::LinuxRawSocket(&local_a0);
  LinuxRawSocket::setOutputInterface(&local_a0,&interface_name_abi_cxx11_);
  if (devices.super__Vector_base<Device,_std::allocator<Device>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      devices.super__Vector_base<Device,_std::allocator<Device>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      pDVar2 = devices.super__Vector_base<Device,_std::allocator<Device>_>._M_impl.
               super__Vector_impl_data._M_start;
      devices.super__Vector_base<Device,_std::allocator<Device>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar3].is_awake = false;
      arp_request._36_2_ = *(undefined2 *)(pDVar2[uVar3].mac_address + 4);
      arp_request._32_4_ = *(undefined4 *)pDVar2[uVar3].mac_address;
      arp_request._38_4_ = *(undefined4 *)pDVar2[uVar3].ip_address;
      LinuxRawSocket::write(&local_a0,0x10d300,(void *)0x2a,uVar3 * 0x38);
      uVar3 = ((long)devices.super__Vector_base<Device,_std::allocator<Device>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)devices.super__Vector_base<Device,_std::allocator<Device>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      bVar5 = uVar4 <= uVar3;
      lVar1 = uVar3 - uVar4;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar5 && lVar1 != 0);
  }
  LinuxRawSocket::~LinuxRawSocket(&local_a0);
  return;
}

Assistant:

void issue_sleep_checks()
{
  // Create a socket to issue requests
  LinuxRawSocket query_socket;
  query_socket.setOutputInterface(interface_name);

  // Get a pointer to the ARP section of the request
  arp_ipv4* arp_req_arp =
    (arp_ipv4*)(arp_request + sizeof(ethernet_ii_header));

  // ARP request to all devices
  for(unsigned int i = 0; i < devices.size(); i++)
  {
    // Mark the device as not awake; if it really is awake, the other thread
    // will receive a response to the coming ARP request and mark it as such
    devices[i].is_awake = false;

    // Update buffer with current device's IP and MAC
    memcpy(arp_req_arp->tha, devices[i].mac_address, 6);
    memcpy(arp_req_arp->tpa, devices[i].ip_address,  4);

    // Issue the request
    query_socket.write((const char*)arp_request,
                       sizeof(ethernet_ii_header) + sizeof(arp_ipv4));
  }
}